

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodecTests.cc
# Opt level: O1

const_iterator avro::parsing::skipCalls(Scanner *sc,Decoder *d,const_iterator it,bool isArray)

{
  byte *pbVar1;
  byte *pbVar2;
  bool bVar3;
  undefined4 *puVar4;
  byte *pbVar5;
  int iVar6;
  char c;
  byte local_c1;
  _func_int **local_c0;
  undefined **local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  assertion_result local_a8;
  char *local_90;
  assertion_result local_88;
  const_string local_70;
  lazy_ostream local_60;
  undefined ***local_50;
  byte *local_48;
  const_string local_40;
  
  local_b8 = &PTR__lazy_ostream_001d8560;
  local_c0 = (_func_int **)&PTR__lazy_ostream_001d8990;
  iVar6 = 0;
  do {
    pbVar1 = (byte *)sc->p;
    pbVar2 = (byte *)sc->end;
    if (pbVar1 == pbVar2) {
      boost::unit_test::anon_unknown_0::s_log_impl();
      std::__cxx11::string::_M_replace
                (0x1dc2b0,0,
                 (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                         m_message._M_string_length,0x1b0701);
      boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
      ;
      boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end =
           "";
      boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x169;
      local_a8._0_8_ = local_a8._0_8_ & 0xffffffffffffff00;
      local_a8.m_message.px = (element_type *)0x0;
      local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_60.m_empty = false;
      local_60._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001d89d0;
      local_50 = (undefined ***)&boost::unit_test::lazy_ostream::inst;
      local_48 = (byte *)0x1adf25;
      local_40.m_begin =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
      ;
      local_40.m_end = "";
      boost::test_tools::tt_detail::report_assertion
                (&local_a8,&local_60,&local_40,0x169,REQUIRE,CHECK_MSG,0);
      boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
      puVar4 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar4 = 0;
      __cxa_throw(puVar4,&int::typeinfo,0);
    }
    pbVar5 = pbVar1 + 1;
    sc->p = (char *)pbVar5;
    local_c1 = *pbVar1;
    bVar3 = true;
    if (local_c1 < 0x73) {
      switch(local_c1) {
      case 0x42:
      case 0x44:
      case 0x46:
      case 0x49:
      case 0x4c:
        d = (Decoder *)((long)d + 0x20);
        break;
      default:
switchD_0017a0b3_caseD_43:
        boost::unit_test::anon_unknown_0::s_log_impl();
        std::__cxx11::string::_M_replace
                  (0x1dc2b0,0,
                   (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                           m_message._M_string_length,0x1b0701);
        boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin
             = 
             "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
        ;
        boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end =
             "";
        boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x166;
        local_88.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(class_property<bool>)0x0;
        local_88.m_message.px = (element_type *)0x0;
        local_88.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
        local_a8._0_8_ = local_b8;
        local_a8.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_90 = "Don\'t know how to skip: ";
        local_60.m_empty = false;
        local_60._vptr_lazy_ostream = local_c0;
        local_50 = (undefined ***)&local_a8;
        local_48 = &local_c1;
        local_70.m_begin =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
        ;
        local_70.m_end = "";
        boost::test_tools::tt_detail::report_assertion
                  (&local_88,&local_60,&local_70,0x166,REQUIRE,CHECK_MSG,0);
        boost::detail::shared_count::~shared_count(&local_88.m_message.pn);
        break;
      case 0x4b:
      case 0x53:
      case 0x62:
      case 0x65:
      case 0x66:
        d = (Decoder *)((long)d + 0x20);
      case 0x55:
      case 99:
        if (pbVar5 < pbVar2) {
          do {
            if (9 < (int)(char)*pbVar5 - 0x30U) break;
            pbVar5 = pbVar5 + 1;
            sc->p = (char *)pbVar5;
          } while (pbVar5 != pbVar2);
        }
        break;
      case 0x4e:
      case 0x52:
        break;
      case 0x5b:
switchD_0017a0b3_caseD_5b:
        iVar6 = iVar6 + 1;
        break;
      case 0x5d:
switchD_0017a0b3_caseD_5d:
        if ((int)(char)local_c1 == ((uint)(byte)((byte)it._M_current ^ 1) << 5 | 0x5d) && iVar6 == 0
           ) {
          iVar6 = 0;
          bVar3 = false;
          local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)d;
        }
        else {
          iVar6 = iVar6 + -1;
        }
      }
    }
    else if (local_c1 != 0x73) {
      if (local_c1 == 0x7d) goto switchD_0017a0b3_caseD_5d;
      if (local_c1 == 0x7b) goto switchD_0017a0b3_caseD_5b;
      goto switchD_0017a0b3_caseD_43;
    }
    if (!bVar3) {
      return (const_iterator)local_b0;
    }
  } while( true );
}

Assistant:

static vector<string>::const_iterator skipCalls(Scanner& sc, Decoder& d,
    vector<string>::const_iterator it, bool isArray)
{
    char end = isArray ? ']' : '}';
    int level = 0;
    while (! sc.isDone()) {
        char c = sc.advance();
        switch (c) {
        case '[':
        case '{':
            ++level;
            break;
        case ']':
        case '}':
            if (c == end && level == 0) {
                return it;
            }
            --level;
            break;
        case 'B':
        case 'I':
        case 'L':
        case 'F':
        case 'D':
            ++it;
            break;
        case 'S':
        case 'K':
        case 'b':
        case 'f':
        case 'e':
            ++it;       // Fall through.
        case 'c':
        case 'U':
            sc.extractInt();
            break;
        case 's':
        case 'N':
        case 'R':
            break;
        default:
            BOOST_FAIL("Don't know how to skip: " << c);
        }
    }
    BOOST_FAIL("End reached while trying to skip");
    throw 0;    // Just to keep the compiler happy.
}